

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateMachinePattern.cpp
# Opt level: O2

void __thiscall State3::executeStateTask(State3 *this)

{
  element_type *peVar1;
  Status *pSVar2;
  int iVar3;
  size_t sVar4;
  __shared_ptr<State,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar1 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"State 3 was here",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)peVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pSVar2 = (this->super_State).spStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"STM: Executing state 3",&local_39);
  Status::setStatusMessage(pSVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  do {
    iVar3 = rand();
    iVar3 = iVar3 % 4 + 1;
    sVar4 = (size_t)iVar3;
    peVar1 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while (peVar1->nPreviousRandomNumber == sVar4);
  peVar1->nPreviousRandomNumber = sVar4;
  if (iVar3 == 4) {
    pSVar2 = (this->super_State).spStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pSVar2->bExecutionStatus = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"STM ERROR: Transition from state 3 to State 4 is forbidden!",
               &local_39);
    Status::setStatusMessage(pSVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    ((this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    bChangeState = false;
    p_Var5 = &(this->super_State).spPossibleNextStates.
              super__Vector_base<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>.
              _M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>;
  }
  else {
    p_Var5 = &(this->super_State).spPossibleNextStates.
              super__Vector_base<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar4 - 1].
              super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_State).spNextState.super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>,
             p_Var5);
  return;
}

Assistant:

void State3::executeStateTask()
{
    spData->vGuestBook.push_back( "State 3 was here" );
    spStatus->setStatusMessage("STM: Executing state 3");
    
    size_t nRsandNum = ( rand() % 4 ) + 1;

    while(spData->nPreviousRandomNumber == nRsandNum)
    {
        nRsandNum = ( rand() % 4 ) + 1;
    }
     
    spData->nPreviousRandomNumber = nRsandNum;
    
    if(nRsandNum == 4)
    {
        spStatus->setStatus(false);
        spStatus->setStatusMessage("STM ERROR: Transition from state 3 to State 4 is forbidden!");
        spData->bChangeState = false;
        spNextState = spPossibleNextStates[1];
    }
    else
    {
        spNextState = spPossibleNextStates[nRsandNum-1];
    }
    
}